

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad_gl.c
# Opt level: O3

int glad_gl_has_extension(int version,char *exts,uint num_exts_i,char **exts_i,char *ext)

{
  byte *__haystack;
  ulong uVar1;
  int iVar2;
  byte *pbVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  
  if (version < 30000) {
    uVar6 = 0;
    if ((ext != (char *)0x0 && exts != (char *)0x0) &&
       (pbVar3 = (byte *)strstr(exts,ext), pbVar3 != (byte *)0x0)) {
      sVar4 = strlen(ext);
      do {
        __haystack = pbVar3 + sVar4;
        if (((pbVar3 == (byte *)exts) || (pbVar3[-1] == 0x20)) && ((*__haystack & 0xdf) == 0))
        goto LAB_0011eec7;
        pbVar3 = (byte *)strstr((char *)__haystack,ext);
        exts = (char *)__haystack;
      } while (pbVar3 != (byte *)0x0);
    }
  }
  else if (num_exts_i == 0) {
    uVar6 = 0;
  }
  else {
    iVar2 = strcmp(*exts_i,ext);
    if (iVar2 == 0) {
LAB_0011eec7:
      uVar6 = 1;
    }
    else {
      uVar1 = 1;
      do {
        uVar5 = uVar1;
        if (num_exts_i == uVar5) break;
        iVar2 = strcmp(exts_i[uVar5],ext);
        uVar1 = uVar5 + 1;
      } while (iVar2 != 0);
      uVar6 = (uint)(uVar5 < num_exts_i);
    }
  }
  return uVar6;
}

Assistant:

static int glad_gl_has_extension(int version, const char *exts, unsigned int num_exts_i, char **exts_i, const char *ext) {
    if(GLAD_VERSION_MAJOR(version) < 3 || !GLAD_GL_IS_SOME_NEW_VERSION) {
        const char *extensions;
        const char *loc;
        const char *terminator;
        extensions = exts;
        if(extensions == NULL || ext == NULL) {
            return 0;
        }
        while(1) {
            loc = strstr(extensions, ext);
            if(loc == NULL) {
                return 0;
            }
            terminator = loc + strlen(ext);
            if((loc == extensions || *(loc - 1) == ' ') &&
                (*terminator == ' ' || *terminator == '\0')) {
                return 1;
            }
            extensions = terminator;
        }
    } else {
        unsigned int index;
        for(index = 0; index < num_exts_i; index++) {
            const char *e = exts_i[index];
            if(strcmp(e, ext) == 0) {
                return 1;
            }
        }
    }
    return 0;
}